

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_get_v3i(exr_const_context_t ctxt,int part_index,char *name,exr_attr_v3i_t *out)

{
  exr_attr_box2i_t *peVar1;
  exr_result_t eVar2;
  exr_attribute_t *attr;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar2 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar2;
    }
    if ((name == (char *)0x0) || (*name == '\0')) {
      eVar2 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid name for v3i attribute query");
      return eVar2;
    }
    eVar2 = exr_attr_list_find_by_name
                      (ctxt,(exr_attribute_list_t *)
                            (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8),
                       name,&attr);
    if (eVar2 == 0) {
      if (attr->type == EXR_ATTR_V3I) {
        if (out == (exr_attr_v3i_t *)0x0) {
          eVar2 = (**(code **)(ctxt + 0x48))(ctxt,3,"NULL output for \'%s\'",name);
        }
        else {
          peVar1 = (attr->field_6).box2i;
          (out->field_0).field_0.z = (peVar1->max).field_0.field_0.x;
          *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)&out->field_0 = (peVar1->min).field_0;
          eVar2 = 0;
        }
      }
      else {
        eVar2 = (**(code **)(ctxt + 0x48))
                          (ctxt,0x10,
                           "\'%s\' requested type \'v3i\', but stored attributes is type \'%s\'",
                           name,attr->type_name);
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_get_v3i (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    exr_attr_v3i_t*     out)
{
    ATTR_GET_IMPL_DEREF (EXR_ATTR_V3I, v3i);
}